

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int asn1_get_sequence_of_cb(void *ctx,int tag,uchar *start,size_t len)

{
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  mbedtls_asn1_sequence *cur;
  asn1_get_sequence_of_cb_ctx_t *cb_ctx;
  undefined4 *local_38;
  
  local_38 = *(undefined4 **)(in_RDI + 8);
  if (*(long *)(local_38 + 4) != 0) {
    pvVar1 = calloc(1,0x20);
    *(void **)(local_38 + 6) = pvVar1;
    if (*(long *)(local_38 + 6) == 0) {
      return -0x6a;
    }
    local_38 = *(undefined4 **)(local_38 + 6);
  }
  *(undefined8 *)(local_38 + 4) = in_RDX;
  *(undefined8 *)(local_38 + 2) = in_RCX;
  *local_38 = in_ESI;
  *(undefined4 **)(in_RDI + 8) = local_38;
  return 0;
}

Assistant:

static int asn1_get_sequence_of_cb(void *ctx,
                                   int tag,
                                   unsigned char *start,
                                   size_t len)
{
    asn1_get_sequence_of_cb_ctx_t *cb_ctx =
        (asn1_get_sequence_of_cb_ctx_t *) ctx;
    mbedtls_asn1_sequence *cur =
        cb_ctx->cur;

    if (cur->buf.p != NULL) {
        cur->next = (struct mbedtls_asn1_sequence *)
            mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

        if (cur->next == NULL) {
            return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        }

        cur = cur->next;
    }

    cur->buf.p = start;
    cur->buf.len = len;
    cur->buf.tag = tag;

    cb_ctx->cur = cur;
    return 0;
}